

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase *
Catch::makeTestCase(ITestInvoker *_testCase,string *_className,NameAndTags *nameAndTags,
                   SourceLineInfo *_lineInfo)

{
  bool bVar1;
  SpecialProperties SVar2;
  reference pcVar3;
  ulong uVar4;
  TestCase *in_RDI;
  TestCaseInfo info;
  SpecialProperties prop;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string _descOrTags;
  bool inTag;
  string tag;
  string desc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  bool isHidden;
  undefined7 in_stack_fffffffffffffe08;
  char in_stack_fffffffffffffe0f;
  TestCaseInfo *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  TestCase *testCase;
  TestCase *in_stack_fffffffffffffe30;
  StringRef *in_stack_fffffffffffffe48;
  SourceLineInfo *in_stack_fffffffffffffe58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  TestCaseInfo *in_stack_fffffffffffffe80;
  SourceLineInfo *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  undefined1 local_101 [33];
  SpecialProperties local_e0;
  char local_d9;
  undefined8 local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  string *local_c8;
  string local_b0 [39];
  byte local_89;
  string local_88 [32];
  string local_68 [63];
  byte local_29;
  
  local_29 = 0;
  testCase = in_RDI;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12c501);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  local_89 = 0;
  StringRef::operator_cast_to_string(in_stack_fffffffffffffe48);
  local_c8 = local_b0;
  local_d0._M_current = (char *)std::__cxx11::string::begin();
  local_d8 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffe10,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08)), bVar1
        ) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d0);
    local_d9 = *pcVar3;
    if ((local_89 & 1) == 0) {
      if (local_d9 == '[') {
        local_89 = 1;
      }
      else {
        std::__cxx11::string::operator+=(local_68,local_d9);
      }
    }
    else if (local_d9 == ']') {
      SVar2 = anon_unknown_1::parseSpecialTag
                        ((string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      local_e0 = SVar2;
      if ((SVar2 & IsHidden) == None) {
        if (SVar2 == None) {
          anon_unknown_1::enforceNotReservedTag(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
          ;
        }
      }
      else {
        local_29 = 1;
      }
      bVar1 = startsWith(&in_stack_fffffffffffffe10->name,in_stack_fffffffffffffe0f);
      if ((bVar1) && (uVar4 = std::__cxx11::string::size(), 1 < uVar4)) {
        std::__cxx11::string::erase((ulong)local_88,0);
      }
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI,(value_type *)CONCAT44(SVar2,in_stack_fffffffffffffe18));
      std::__cxx11::string::clear();
      local_89 = 0;
    }
    else {
      std::__cxx11::string::operator+=(local_88,local_d9);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_d0);
  }
  if ((local_29 & 1) != 0) {
    in_stack_fffffffffffffe10 = (TestCaseInfo *)local_101;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_101 + 1),".",(allocator *)in_stack_fffffffffffffe10);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe10,
                (value_type *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    std::__cxx11::string::~string((string *)(local_101 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_101);
  }
  StringRef::operator_cast_to_string(in_stack_fffffffffffffe48);
  TestCaseInfo::TestCaseInfo
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  TestCase::TestCase(in_stack_fffffffffffffe30,(ITestInvoker *)testCase,&in_RDI->super_TestCaseInfo)
  ;
  TestCaseInfo::~TestCaseInfo(in_stack_fffffffffffffe10);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  return testCase;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        std::string _descOrTags = nameAndTags.tags;
        for (char c : _descOrTags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.push_back( "." );
        }

        TestCaseInfo info( nameAndTags.name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }